

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object.c
# Opt level: O2

int object_decrement_reference(object obj)

{
  int iVar1;
  
  iVar1 = 1;
  if ((obj != (object)0x0) && ((obj->ref).count != 0)) {
    LOCK();
    (obj->ref).count = (obj->ref).count - 1;
    UNLOCK();
    LOCK();
    object_stats.decrements = object_stats.decrements + 1;
    UNLOCK();
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int object_decrement_reference(object obj)
{
	if (obj == NULL)
	{
		return 1;
	}

	if (threading_atomic_ref_count_decrement(&obj->ref) == 1)
	{
		return 1;
	}

	reflect_memory_tracker_decrement(object_stats);

	return 0;
}